

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

void __thiscall CVmDateLocale::set(CVmDateLocale *this,CVmUndo *undo,int idx,vm_val_t *val)

{
  CVmObjPageEntry *pCVar1;
  long lVar2;
  vm_obj_id_t vVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  CVmObjVector *pCVar6;
  vm_val_t nil;
  vm_val_t local_40;
  
  if (this->vec == (CVmObjVector *)0x0) {
    pCVar6 = (CVmObjVector *)0x0;
    vVar3 = CVmObjVector::create(0,0xf);
    this->vecid = vVar3;
    if (vVar3 != 0) {
      iVar4 = (**(code **)(*(long *)&G_obj_table_X.pages_[vVar3 >> 0xc][vVar3 & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[vVar3 >> 0xc] + (vVar3 & 0xfff),
                         CVmObjVector::metaclass_reg_);
      if (iVar4 == 0) {
        pCVar6 = (CVmObjVector *)0x0;
      }
      else {
        pCVar6 = (CVmObjVector *)
                 ((G_obj_table_X.pages_[this->vecid >> 0xc]->ptr_).obj_ +
                 (this->vecid & 0xfff) * 0x18);
      }
    }
    this->vec = pCVar6;
    local_40.typ = VM_NIL;
    iVar4 = 0xf;
    do {
      CVmObjVector::append_element(this->vec,this->vecid,&local_40);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    vVar3 = this->vecid;
    CVmMetaclass::get_class_obj(CVmObjDate::metaclass_reg_);
    vVar5 = CVmMetaclass::get_class_obj(CVmObjDate::metaclass_reg_);
    (**(code **)(*(long *)&G_obj_table_X.pages_[vVar5 >> 0xc][vVar5 & 0xfff].ptr_ + 8))
              (G_obj_table_X.pages_[vVar5 >> 0xc] + (vVar5 & 0xfff),CVmObjClass::metaclass_reg_);
    vVar5 = CVmMetaclass::get_class_obj(CVmObjDate::metaclass_reg_);
    pCVar1 = G_obj_table_X.pages_[vVar5 >> 0xc];
    lVar2 = *(long *)((long)&pCVar1[vVar5 & 0xfff].ptr_ + 8);
    *(undefined4 *)(lVar2 + 8) = 5;
    *(vm_obj_id_t *)(lVar2 + 0x10) = vVar3;
    *(undefined4 *)(*(long *)((long)&pCVar1[vVar5 & 0xfff].ptr_ + 8) + 0x18) = 1;
  }
  if ((uint)idx < 0xf) {
    CVmObjVector::set_element_undo(this->vec,this->vecid,(ulong)(uint)idx,val);
    return;
  }
  err_throw(0x7df);
}

Assistant:

void set(VMG_ CVmUndo *undo, int idx, const vm_val_t *val)
    {
        /* if we don't have a vector, create one */
        if (vec == 0)
        {
            /* create the vector */
            vecid = CVmObjVector::create(vmg_ FALSE, ndefaults);
            vec = vm_objid_cast(CVmObjVector, vecid);

            /* initialize all elements to nil */
            vm_val_t nil;
            nil.set_nil();
            for (int i = 0 ; i < ndefaults ; ++i)
                vec->append_element(vmg_ vecid, &nil);

            /* store the vector in the class object's state holder */
            vm_val_t val;
            val.set_obj(vecid);
            vm_classobj_for(CVmObjDate)->set_class_state(&val);
        }

        /* if it's out of bounds, it's an error */
        if (idx < 0 || idx >= ndefaults)
            err_throw(VMERR_INDEX_OUT_OF_RANGE);

        /* set the specified element */
        vec->set_element_undo(vmg_ vecid, idx, val);
    }